

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O2

uint64_t absl::anon_unknown_0::PrepareEightDigits(uint32_t i)

{
  ulong uVar1;
  long lVar2;
  
  uVar1 = (ulong)i / 10000 | (ulong)i % 10000 << 0x20;
  lVar2 = uVar1 * 0x10000 + (uVar1 * 0x28f6 >> 0x14 & 0x7f0000007f) * -0x63ffff;
  return lVar2 * 0x100 + ((ulong)(lVar2 * 0x67) >> 10 & 0xf000f000f000f) * -0x9ff;
}

Assistant:

inline uint64_t PrepareEightDigits(uint32_t i) {
  ABSL_ASSUME(i < 10000'0000);
  // Prepare 2 blocks of 4 digits "in parallel".
  uint32_t hi = i / 10000;
  uint32_t lo = i % 10000;
  uint64_t merged = hi | (uint64_t{lo} << 32);
  uint64_t div100 = ((merged * kDivisionBy100Mul) / kDivisionBy100Div) &
                    ((0x7Full << 32) | 0x7Full);
  uint64_t mod100 = merged - 100ull * div100;
  uint64_t hundreds = (mod100 << 16) + div100;
  uint64_t tens = (hundreds * kDivisionBy10Mul) / kDivisionBy10Div;
  tens &= (0xFull << 48) | (0xFull << 32) | (0xFull << 16) | 0xFull;
  tens += (hundreds - 10ull * tens) << 8;
  return tens;
}